

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_INCDECP_z(DisasContext_conflict1 *s,arg_incdec2_pred *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  TCGv_i64 val_00;
  code *pcVar6;
  GVecGen2sFn *gvec_fn;
  TCGv_i64 val;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_incdec2_pred *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      iVar3 = vec_full_reg_size(s);
      val_00 = tcg_temp_new_i64(tcg_ctx_00);
      pcVar6 = tcg_gen_gvec_adds_aarch64;
      if (a->d != 0) {
        pcVar6 = tcg_gen_gvec_subs_aarch64;
      }
      do_cntp(s,val_00,a->esz,a->pg,a->pg);
      iVar1 = a->esz;
      iVar4 = vec_full_reg_offset(s,a->rd);
      iVar5 = vec_full_reg_offset(s,a->rn);
      (*pcVar6)(tcg_ctx_00,iVar1,iVar4,iVar5,val_00,iVar3,iVar3);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_INCDECP_z(DisasContext *s, arg_incdec2_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
        GVecGen2sFn *gvec_fn = a->d ? tcg_gen_gvec_subs : tcg_gen_gvec_adds;

        do_cntp(s, val, a->esz, a->pg, a->pg);
        gvec_fn(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                vec_full_reg_offset(s, a->rn), val, vsz, vsz);
    }
    return true;
}